

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O0

bool __thiscall EOPlus::Lexer::GetCharIf(Lexer *this,char *c,function<bool_(char)> *f)

{
  bool bVar1;
  char local_29;
  function<bool_(char)> *pfStack_28;
  char cc;
  function<bool_(char)> *f_local;
  char *c_local;
  Lexer *this_local;
  
  local_29 = '\0';
  pfStack_28 = f;
  f_local = (function<bool_(char)> *)c;
  c_local = (char *)this;
  bVar1 = PeekChar(this,&local_29);
  if ((bVar1) && (bVar1 = std::function<bool_(char)>::operator()(f,local_29), bVar1)) {
    this_local._7_1_ = GetChar(this,(char *)f_local);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Lexer::GetCharIf(char& c, std::function<bool(char)> f)
	{
		char cc = '\0';

		if (!this->PeekChar(cc) || !f(cc))
			return false;

		return this->GetChar(c);
	}